

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::Scrollbar(ImGuiLayoutType direction)

{
  bool bVar1;
  ImGuiID IVar2;
  ImGuiWindow *this;
  ImDrawList *this_00;
  undefined1 auVar3 [12];
  ulong uVar4;
  ImGuiContext *pIVar5;
  ImGuiID id;
  ImU32 IVar6;
  ImRect *pIVar7;
  char *str;
  ImGuiCol idx;
  uint uVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  int iVar13;
  int iVar14;
  undefined1 auVar12 [12];
  int iVar15;
  float fVar16;
  undefined8 in_XMM1_Qa;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  ImRect IVar23;
  long lStack_100;
  bool held;
  bool hovered;
  undefined1 local_e8 [8];
  ImVec2 IStack_e0;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  local_d8._8_8_ = local_d8._0_8_;
  this = GImGui->CurrentWindow;
  str = "#SCROLLY";
  if (direction == 0) {
    str = "#SCROLLX";
  }
  id = ImGuiWindow::GetID(this,str,(char *)0x0);
  bVar1 = (&this->ScrollbarX)[direction == 0];
  local_a8 = 0.0;
  if (bVar1 == true) {
    local_a8 = (pIVar5->Style).ScrollbarSize;
  }
  IVar23 = ImGuiWindow::Rect(this);
  local_78._0_8_ = IVar23.Max;
  local_78._8_8_ = in_XMM1_Qa;
  IStack_e0.y = this->WindowBorderSize;
  fVar9 = IVar23.Max.x;
  local_68 = IVar23.Max.y;
  fStack_64 = local_68;
  fStack_60 = local_68;
  fStack_5c = local_68;
  if (direction == 0) {
    fVar10 = (this->Pos).x + IStack_e0.y;
    local_e8._4_4_ = local_68 - (pIVar5->Style).ScrollbarSize;
    local_d8._0_4_ = (fVar9 - local_a8) - IStack_e0.y;
    local_c8._0_4_ = local_68 - IStack_e0.y;
    local_e8._0_4_ = fVar10;
    IStack_e0.x = (float)local_d8._0_4_;
    IStack_e0.y = (float)local_c8;
  }
  else {
    local_e8._0_4_ = fVar9 - (pIVar5->Style).ScrollbarSize;
    local_b8._0_4_ = (this->Pos).y + IStack_e0.y;
    local_d8._4_12_ = local_78._4_12_;
    local_d8._0_4_ = fVar9 - IStack_e0.y;
    IStack_e0.y = (local_68 - local_a8) - IStack_e0.y;
    local_c8 = CONCAT44(local_68,IStack_e0.y);
    fStack_c0 = local_68;
    fStack_bc = local_68;
    local_88 = (float)local_e8._0_4_;
    IStack_e0.x = (float)local_d8._0_4_;
    fVar9 = ImGuiWindow::TitleBarHeight(this);
    fVar10 = 0.0;
    if ((this->Flags & 0x400) != 0) {
      local_98._0_4_ = fVar9;
      fVar10 = ImGuiWindow::MenuBarHeight(this);
      fVar9 = (float)local_98._0_4_;
    }
    local_e8._4_4_ = (float)local_b8._0_4_ + fVar9 + fVar10;
    fVar10 = local_88;
  }
  if ((0.0 < (float)local_d8._0_4_ - fVar10) && (0.0 < (float)local_c8 - (float)local_e8._4_4_)) {
    if (direction == 0) {
      iVar11 = (uint)(bVar1 ^ 1) * 8 + 4;
      local_d8._0_8_ = 0x20;
      lStack_100 = 0x30;
    }
    else {
      iVar11 = ((uint)~this->Flags >> 9 & -(this->Flags & 1U) & 2) + (uint)(bVar1 ^ 1) * 8;
      local_d8._0_8_ = 0x24;
      lStack_100 = 0x34;
    }
    local_c8 = lStack_100;
    this_00 = this->DrawList;
    IVar6 = GetColorU32(0xe,1.0);
    ImDrawList::AddRectFilled
              (this_00,(ImVec2 *)local_e8,&IStack_e0,IVar6,this->WindowRounding,iVar11);
    iVar11 = (int)(((IStack_e0.x - (float)local_e8._0_4_) + -2.0) * 0.5);
    iVar13 = (int)(((IStack_e0.y - (float)local_e8._4_4_) + -2.0) * 0.5);
    iVar14 = (int)(((IStack_e0.x - IStack_e0.x) + 0.0) * 0.0);
    iVar15 = (int)(((IStack_e0.y - IStack_e0.y) + 0.0) * 0.0);
    auVar20._0_4_ = -(uint)(iVar11 < 0);
    auVar20._4_4_ = -(uint)(iVar13 < 0);
    auVar20._8_4_ = -(uint)(iVar14 < 0);
    auVar20._12_4_ = -(uint)(iVar15 < 0);
    auVar21._0_4_ = -(uint)(3 < iVar11);
    auVar21._4_4_ = -(uint)(3 < iVar13);
    auVar21._8_4_ = -(uint)(0 < iVar14);
    auVar21._12_4_ = -(uint)(0 < iVar15);
    auVar17._0_8_ = CONCAT44((float)iVar13,(float)iVar11) ^ 0x8000000080000000;
    auVar17._8_4_ = -(float)iVar14;
    auVar17._12_4_ = -(float)iVar15;
    auVar21 = auVar20 & _DAT_0018e1b0 | ~auVar20 & (auVar21 & _DAT_0018e1a0 | ~auVar21 & auVar17);
    fStack_c0 = auVar21._0_4_;
    fVar9 = auVar21._4_4_;
    auVar18._0_8_ = auVar21._0_8_;
    auVar18._8_4_ = fStack_c0;
    auVar18._12_4_ = fVar9;
    local_e8._0_4_ = (float)local_e8._0_4_ - fStack_c0;
    fStack_c0 = IStack_e0.x + fStack_c0;
    fStack_bc = IStack_e0.y + fVar9;
    auVar3._4_8_ = auVar18._8_8_;
    auVar3._0_4_ = (float)local_e8._4_4_ + fVar9;
    auVar19._0_8_ = auVar3._0_8_ << 0x20;
    auVar19._8_4_ = fStack_c0;
    auVar19._12_4_ = fStack_bc;
    IStack_e0 = auVar19._8_8_;
    local_88 = (float)local_e8._0_4_;
    if (direction != 0) {
      fStack_c0 = fStack_bc;
      local_88 = (float)local_e8._4_4_ - fVar9;
    }
    local_88 = fStack_c0 - local_88;
    local_b8 = ZEXT416((uint)(&(this->Scroll).x)[direction != 0]);
    local_a8 = *(float *)((long)&this->Name + local_d8._0_8_) - local_a8;
    local_98 = ZEXT416((uint)local_a8);
    fVar10 = *(float *)((long)&this->Name + local_c8);
    local_d8 = ZEXT416((uint)fVar10);
    fVar10 = (float)(~-(uint)(local_a8 <= fVar10) & (uint)local_a8 |
                    -(uint)(local_a8 <= fVar10) & (uint)fVar10);
    if (fVar10 <= 1.0) {
      fVar10 = 1.0;
    }
    fVar22 = (local_a8 / fVar10) * local_88;
    fVar10 = (pIVar5->Style).GrabMinSize;
    fVar16 = local_88;
    if (fVar22 <= local_88) {
      fVar16 = fVar22;
    }
    uVar8 = -(uint)(fVar22 < fVar10);
    local_a8 = (float)(uVar8 & (uint)fVar10 | ~uVar8 & (uint)fVar16);
    local_c8 = CONCAT44(fStack_bc,local_a8 / local_88);
    held = false;
    hovered = false;
    IVar2 = pIVar5->ActiveId;
    local_e8._4_4_ = (float)local_e8._4_4_ - fVar9;
    fStack_a4 = fStack_bc;
    fStack_a0 = fStack_c0;
    fStack_9c = fStack_bc;
    fStack_84 = fStack_bc;
    fStack_80 = fStack_c0;
    fStack_7c = fStack_bc;
    ButtonBehavior((ImRect *)local_e8,id,&hovered,&held,0x2000);
    fVar9 = 1.0;
    if (1.0 <= (float)local_d8._0_4_ - (float)local_98._0_4_) {
      fVar9 = (float)local_d8._0_4_ - (float)local_98._0_4_;
    }
    fVar10 = (float)local_b8._0_4_ / fVar9;
    auVar12 = ZEXT812(0x3f800000);
    if (fVar10 <= 1.0) {
      auVar12._4_8_ = 0;
      auVar12._0_4_ = fVar10;
    }
    local_b8._4_4_ = 0;
    local_b8._0_4_ =
         ((float)(~-(uint)(fVar10 < 0.0) & auVar12._0_4_) * (local_88 - local_a8)) / local_88;
    local_b8._8_4_ = ~local_b8._8_4_ & auVar12._8_4_;
    local_b8._12_4_ = 0;
    if (((float)local_c8 < 1.0) && (held != false)) {
      local_98._0_4_ = local_88 - local_a8;
      local_d8._0_4_ = fVar9;
      pIVar7 = (ImRect *)(local_e8 + 4);
      if (direction == 0) {
        pIVar7 = (ImRect *)local_e8;
      }
      uVar4 = (ulong)(direction != 0);
      local_58 = ZEXT416((uint)(*(float *)((pIVar5->IO).MouseDown + uVar4 * 4 + -8) -
                               (pIVar7->Min).x));
      SetHoveredID(id);
      fVar10 = (float)local_58._0_4_ / local_88;
      fVar9 = 1.0;
      if (fVar10 <= 1.0) {
        fVar9 = fVar10;
      }
      fVar9 = (float)(~-(uint)(fVar10 < 0.0) & (uint)fVar9);
      if (IVar2 == id) {
        fVar10 = (&(pIVar5->ScrollbarClickDeltaToGrabCenter).x)[uVar4];
        bVar1 = false;
      }
      else if ((fVar9 < (float)local_b8._0_4_) || ((float)local_c8 + (float)local_b8._0_4_ < fVar9))
      {
        (&(pIVar5->ScrollbarClickDeltaToGrabCenter).x)[uVar4] = 0.0;
        bVar1 = true;
        fVar10 = 0.0;
      }
      else {
        fVar10 = (float)local_c8 * -0.5 + (fVar9 - (float)local_b8._0_4_);
        (&(pIVar5->ScrollbarClickDeltaToGrabCenter).x)[uVar4] = fVar10;
        bVar1 = false;
      }
      fVar16 = ((fVar9 - fVar10) - (float)local_c8 * 0.5) / (1.0 - (float)local_c8);
      fVar10 = 1.0;
      if (fVar16 <= 1.0) {
        fVar10 = fVar16;
      }
      fVar16 = (float)(int)((float)(~-(uint)(fVar16 < 0.0) & (uint)fVar10) * (float)local_d8._0_4_ +
                           0.5);
      (&(this->Scroll).x)[direction != 0] = fVar16;
      fVar16 = fVar16 / (float)local_d8._0_4_;
      fVar10 = 1.0;
      if (fVar16 <= 1.0) {
        fVar10 = fVar16;
      }
      fVar10 = ((float)local_98._0_4_ * (float)(~-(uint)(fVar16 < 0.0) & (uint)fVar10)) / local_88;
      local_b8 = ZEXT416((uint)fVar10);
      if (bVar1) {
        (&(pIVar5->ScrollbarClickDeltaToGrabCenter).x)[uVar4] =
             -(float)local_c8 * 0.5 + (fVar9 - fVar10);
      }
    }
    idx = 0x11;
    if (held == false) {
      idx = (hovered & 1) + 0xf;
    }
    IVar6 = GetColorU32(idx,1.0);
    if (direction == 0) {
      local_40.x = (float)local_e8._0_4_ +
                   (IStack_e0.x - (float)local_e8._0_4_) * (float)local_b8._0_4_;
      local_38.x = local_a8 + local_40.x;
      local_38.y = IStack_e0.y;
      local_40.y = (float)local_e8._4_4_;
      if ((float)local_78._0_4_ <= local_a8 + local_40.x) {
        local_38.x = (float)local_78._0_4_;
      }
    }
    else {
      local_40.y = (IStack_e0.y - (float)local_e8._4_4_) * (float)local_b8._0_4_ +
                   (float)local_e8._4_4_;
      local_38.y = local_a8 + local_40.y;
      local_38.x = IStack_e0.x;
      local_40.x = (float)local_e8._0_4_;
      if (local_68 <= local_38.y) {
        local_38.y = local_68;
      }
    }
    ImDrawList::AddRectFilled
              (this->DrawList,&local_40,&local_38,IVar6,(pIVar5->Style).ScrollbarRounding,0xf);
  }
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiLayoutType direction)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const bool horizontal = (direction == ImGuiLayoutType_Horizontal);
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(horizontal ? "#SCROLLX" : "#SCROLLY");

    // Render background
    bool other_scrollbar = (horizontal ? window->ScrollbarY : window->ScrollbarX);
    float other_scrollbar_size_w = other_scrollbar ? style.ScrollbarSize : 0.0f;
    const ImRect window_rect = window->Rect();
    const float border_size = window->WindowBorderSize;
    ImRect bb = horizontal
        ? ImRect(window->Pos.x + border_size, window_rect.Max.y - style.ScrollbarSize, window_rect.Max.x - other_scrollbar_size_w - border_size, window_rect.Max.y - border_size)
        : ImRect(window_rect.Max.x - style.ScrollbarSize, window->Pos.y + border_size, window_rect.Max.x - border_size, window_rect.Max.y - other_scrollbar_size_w - border_size);
    if (!horizontal)
        bb.Min.y += window->TitleBarHeight() + ((window->Flags & ImGuiWindowFlags_MenuBar) ? window->MenuBarHeight() : 0.0f);
    if (bb.GetWidth() <= 0.0f || bb.GetHeight() <= 0.0f)
        return;

    int window_rounding_corners;
    if (horizontal)
        window_rounding_corners = ImDrawCornerFlags_BotLeft | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    else
        window_rounding_corners = (((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? ImDrawCornerFlags_TopRight : 0) | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_ScrollbarBg), window->WindowRounding, window_rounding_corners);
    bb.Expand(ImVec2(-ImClamp((float)(int)((bb.Max.x - bb.Min.x - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp((float)(int)((bb.Max.y - bb.Min.y - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    float scrollbar_size_v = horizontal ? bb.GetWidth() : bb.GetHeight();
    float scroll_v = horizontal ? window->Scroll.x : window->Scroll.y;
    float win_size_avail_v = (horizontal ? window->SizeFull.x : window->SizeFull.y) - other_scrollbar_size_w;
    float win_size_contents_v = horizontal ? window->SizeContents.x : window->SizeContents.y;

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(win_size_contents_v, win_size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(win_size_contents_v, win_size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (win_size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    const bool previously_held = (g.ActiveId == id);
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, win_size_contents_v - win_size_avail_v);
    float scroll_ratio = ImSaturate(scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;
    if (held && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = horizontal ? bb.Min.x : bb.Min.y;
        float mouse_pos_v = horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
        float* click_delta_to_grab_center_v = horizontal ? &g.ScrollbarClickDeltaToGrabCenter.x : &g.ScrollbarClickDeltaToGrabCenter.y;

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (!previously_held)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            if (clicked_v_norm >= grab_v_norm && clicked_v_norm <= grab_v_norm + grab_h_norm)
            {
                *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
            }
            else
            {
                seek_absolute = true;
                *click_delta_to_grab_center_v = 0.0f;
            }
        }

        // Apply scroll
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of SizeContents and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - *click_delta_to_grab_center_v - grab_h_norm*0.5f) / (1.0f - grab_h_norm));
        scroll_v = (float)(int)(0.5f + scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));
        if (horizontal)
            window->Scroll.x = scroll_v;
        else
            window->Scroll.y = scroll_v;

        // Update values for rendering
        scroll_ratio = ImSaturate(scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
    }

    // Render
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab);
    ImRect grab_rect;
    if (horizontal)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImMin(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, window_rect.Max.x), bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImMin(ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels, window_rect.Max.y));
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);
}